

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O0

void __thiscall QSqlQuery::QSqlQuery(QSqlQuery *this,QSqlResult *result)

{
  QSqlQueryPrivate *this_00;
  undefined8 *in_RDI;
  QSqlResult *in_stack_ffffffffffffffd8;
  
  this_00 = (QSqlQueryPrivate *)operator_new(0x10);
  QSqlQueryPrivate::QSqlQueryPrivate(this_00,in_stack_ffffffffffffffd8);
  *in_RDI = this_00;
  return;
}

Assistant:

QSqlQuery::QSqlQuery(QSqlResult *result)
{
    d = new QSqlQueryPrivate(result);
}